

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::MPSegment::CutByDag
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *dags,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words)

{
  pointer pDVar1;
  DictUnit *pDVar2;
  size_t sVar3;
  ulong uVar4;
  WordRange wr;
  
  uVar4 = 0;
  do {
    pDVar1 = (dags->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(dags->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x148) <= uVar4)
    {
      return;
    }
    pDVar2 = pDVar1[uVar4].pInfo;
    if (pDVar2 == (DictUnit *)0x0) {
      wr.left = begin + uVar4;
      wr.right = wr.left;
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(words,&wr);
      sVar3 = 1;
    }
    else {
      sVar3 = (pDVar2->word).size_;
      if (sVar3 == 0) {
        __assert_fail("p->word.size() >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/MPSegment.hpp"
                      ,0x75,
                      "void cppjieba::MPSegment::CutByDag(RuneStrArray::const_iterator, RuneStrArray::const_iterator, const vector<Dag> &, vector<WordRange> &) const"
                     );
      }
      wr.left = begin + uVar4;
      wr.right = wr.left + (sVar3 - 1);
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(words,&wr);
      sVar3 = (pDVar2->word).size_;
    }
    uVar4 = uVar4 + sVar3;
  } while( true );
}

Assistant:

void CutByDag(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        const vector<Dag>& dags, 
        vector<WordRange>& words) const {
    size_t i = 0;
    while (i < dags.size()) {
      const DictUnit* p = dags[i].pInfo;
      if (p) {
        assert(p->word.size() >= 1);
        WordRange wr(begin + i, begin + i + p->word.size() - 1);
        words.push_back(wr);
        i += p->word.size();
      } else { //single chinese word
        WordRange wr(begin + i, begin + i);
        words.push_back(wr);
        i++;
      }
    }
  }